

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void readGZ2(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  GZ *pGVar2;
  _Base_ptr in_RCX;
  int *in_RDX;
  Array2D<GZ> *in_RSI;
  char *in_RDI;
  FrameBuffer frameBuffer;
  int dy;
  int dx;
  Box2i dw;
  InputFile file;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffeb4;
  long in_stack_fffffffffffffec0;
  long in_stack_fffffffffffffec8;
  Array2D<GZ> *in_stack_fffffffffffffed0;
  Slice local_108 [56];
  Slice local_d0 [56];
  char local_98 [52];
  int local_64;
  int local_60;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  FrameBuffer local_40;
  Array2D<GZ> *local_10;
  
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RCX;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_RDX;
  local_10 = in_RSI;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_40,in_RDI,iVar1);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  *(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (local_48 - local_50) + 1
  ;
  (local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color =
       (local_44 - local_4c) + _S_black;
  local_60 = local_50;
  local_64 = local_4c;
  Imf_3_4::Array2D<GZ>::resizeErase
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x10cd8c);
  pGVar2 = Imf_3_4::Array2D<GZ>::operator[](local_10,(long)-local_64);
  Imf_3_4::Slice::Slice
            (local_d0,HALF,(char *)(pGVar2 + -local_60),8,
             (long)*(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count << 3,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_98,(Slice *)"G");
  pGVar2 = Imf_3_4::Array2D<GZ>::operator[](local_10,(long)-local_64);
  uVar3 = 0;
  Imf_3_4::Slice::Slice
            (local_108,FLOAT,(char *)&pGVar2[-local_60].z,8,
             (long)*(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count << 3,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_98,(Slice *)0x1206a1);
  Imf_3_4::InputFile::setFrameBuffer(&local_40);
  Imf_3_4::InputFile::readPixels((int)&local_40,local_4c);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10cefc);
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffeb4,uVar3));
  return;
}

Assistant:

void
readGZ2 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    //
    // Read an image using class InputFile.  Try to read one channel,
    // G, of type HALF, and one channel, Z, of type FLOAT.  In memory,
    // the G and Z channels will be interleaved in a single buffer.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the GZ pixel buffer
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;
    int dx   = dw.min.x;
    int dy   = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                       // type
            (char*) &pixels[-dy][-dx].g,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                      // type
            (char*) &pixels[-dy][-dx].z,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}